

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

int __thiscall
QListModeViewBase::perItemScrollToValue
          (QListModeViewBase *this,int index,int scrollValue,int viewportSize,ScrollHint hint,
          Orientation orientation,bool wrap,int itemExtent)

{
  uint uVar1;
  QListViewPrivate *this_00;
  int *piVar2;
  int *piVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  iterator iVar9;
  iterator iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  undefined1 *puVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  long in_FS_OFFSET;
  QList<int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (index < 0) goto LAB_00570987;
  this_00 = (this->super_QCommonListViewBase).dd;
  iVar18 = itemExtent + this_00->space;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QListViewPrivate::hiddenRowIds(&local_58,this_00);
  iVar9 = QList<int>::begin(&local_58);
  iVar10 = QList<int>::end(&local_58);
  if (iVar9.i != iVar10.i) {
    uVar11 = (long)iVar10.i - (long)iVar9.i >> 2;
    lVar13 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    std::__introsort_loop<QList<int>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar9.i,iVar10.i,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<QList<int>::iterator,__gnu_cxx::__ops::_Iter_less_iter>();
  }
  uVar7 = 0;
  if ((undefined1 *)0x1 < (ulong)local_58.d.size) {
    puVar15 = (undefined1 *)0x0;
    do {
      uVar7 = (uint)puVar15;
      if ((int)(index + (uint)puVar15) < local_58.d.ptr[(long)puVar15]) break;
      puVar15 = puVar15 + 1;
      uVar7 = (int)local_58.d.size - 1;
    } while ((undefined1 *)(local_58.d.size + -1) != puVar15);
  }
  if (wrap) {
    if (Vertical - (((this->super_QCommonListViewBase).dd)->flow == LeftToRight) == orientation) {
      iVar8 = (this->flowPositions).d.ptr[uVar7 + index];
    }
    else {
      lVar13 = (this->segmentStartRows).d.size;
      iVar8 = scrollValue;
      if (lVar13 != 0) {
        iVar8 = (int)lVar13;
        iVar12 = iVar8 + -1;
        iVar8 = iVar8 >> 1;
        if (0 < iVar12) {
          iVar14 = 0;
          iVar16 = iVar8;
          do {
            if (index < (this->segmentStartRows).d.ptr[iVar16]) {
              iVar12 = iVar16 + -1;
              iVar16 = iVar14;
            }
            iVar8 = iVar12 + iVar16 + 1 >> 1;
            bVar4 = iVar16 < iVar12;
            iVar14 = iVar16;
            iVar16 = iVar8;
          } while (bVar4);
        }
        lVar13 = (long)iVar8;
        piVar3 = (this->segmentPositions).d.ptr;
        piVar2 = piVar3 + lVar13;
        iVar12 = scrollValue;
        if (iVar8 < scrollValue) {
          iVar12 = iVar8;
        }
        do {
          if (lVar13 <= scrollValue) goto LAB_00570908;
          lVar5 = lVar13 + -1;
          lVar13 = lVar13 + -1;
        } while ((iVar18 + *piVar2) - piVar3[lVar5] <= viewportSize);
        iVar12 = (int)lVar13 + 1;
LAB_00570908:
        if (hint != PositionAtTop) {
          if (hint != PositionAtCenter) goto joined_r0x0057092f;
          iVar8 = iVar8 - (((iVar8 - iVar12) - ((iVar8 - iVar12) + 1 >> 0x1f)) + 1 >> 1);
        }
      }
    }
  }
  else {
    iVar12 = 0;
    if (index != 0) {
      piVar2 = (this->flowPositions).d.ptr;
      uVar1 = uVar7 + index;
      iVar8 = index + -1;
      iVar16 = index;
      do {
        iVar12 = iVar16;
        if (viewportSize < (iVar18 + piVar2[uVar1]) - piVar2[(long)(int)(uVar7 + iVar16) + -1])
        break;
        uVar17 = (int)uVar7 >> 0x1f & uVar7;
        iVar12 = uVar7 + iVar8;
        uVar11 = (ulong)uVar7;
        uVar6 = uVar7 + 1;
        do {
          uVar7 = uVar17;
          if ((int)uVar11 < 1) break;
          iVar12 = iVar12 + -1;
          uVar7 = uVar6 - 1;
          lVar13 = uVar11 - 1;
          uVar11 = uVar11 - 1;
          uVar6 = uVar7;
        } while (iVar12 <= local_58.d.ptr[lVar13]);
        iVar8 = iVar8 + -1;
        bVar4 = 1 < iVar16;
        iVar16 = iVar16 + -1;
        iVar12 = 0;
      } while (bVar4);
    }
    iVar8 = index;
    if (hint != PositionAtTop) {
      if (hint == PositionAtCenter) {
        iVar8 = index - (((index - iVar12) - ((index - iVar12) + 1 >> 0x1f)) + 1 >> 1);
      }
      else {
joined_r0x0057092f:
        iVar8 = scrollValue;
        if (hint == PositionAtBottom) {
          iVar8 = iVar12;
        }
      }
    }
  }
  scrollValue = iVar8;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
    }
  }
LAB_00570987:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return scrollValue;
}

Assistant:

int QListModeViewBase::perItemScrollToValue(int index, int scrollValue, int viewportSize,
                                                 QAbstractItemView::ScrollHint hint,
                                                 Qt::Orientation orientation, bool wrap, int itemExtent) const
{
    if (index < 0)
        return scrollValue;

    itemExtent += spacing();
    QList<int> hiddenRows = dd->hiddenRowIds();
    std::sort(hiddenRows.begin(), hiddenRows.end());
    int hiddenRowsBefore = 0;
    for (int i = 0; i < hiddenRows.size() - 1; ++i)
        if (hiddenRows.at(i) > index + hiddenRowsBefore)
            break;
        else
            ++hiddenRowsBefore;
    if (!wrap) {
        int topIndex = index;
        const int bottomIndex = topIndex;
        const int bottomCoordinate = flowPositions.at(index + hiddenRowsBefore);
        while (topIndex > 0 &&
               (bottomCoordinate - flowPositions.at(topIndex + hiddenRowsBefore - 1) + itemExtent) <= (viewportSize)) {
            topIndex--;
            // will the next one be a hidden row -> skip
            while (hiddenRowsBefore > 0 && hiddenRows.at(hiddenRowsBefore - 1) >= topIndex + hiddenRowsBefore - 1)
                hiddenRowsBefore--;
        }

        const int itemCount = bottomIndex - topIndex + 1;
        switch (hint) {
        case QAbstractItemView::PositionAtTop:
            return index;
        case QAbstractItemView::PositionAtBottom:
            return index - itemCount + 1;
        case QAbstractItemView::PositionAtCenter:
            return index - (itemCount / 2);
        default:
            break;
        }
    } else { // wrapping
        Qt::Orientation flowOrientation = (flow() == QListView::LeftToRight
                                           ? Qt::Horizontal : Qt::Vertical);
        if (flowOrientation == orientation) { // scrolling in the "flow" direction
            // ### wrapped scrolling in the flow direction
            return flowPositions.at(index + hiddenRowsBefore); // ### always pixel based for now
        } else if (!segmentStartRows.isEmpty()) { // we are scrolling in the "segment" direction
            int segment = qBinarySearch<int>(segmentStartRows, index, 0, segmentStartRows.size() - 1);
            int leftSegment = segment;
            const int rightSegment = leftSegment;
            const int bottomCoordinate = segmentPositions.at(segment);

            while (leftSegment > scrollValue &&
                (bottomCoordinate - segmentPositions.at(leftSegment-1) + itemExtent) <= (viewportSize)) {
                    leftSegment--;
            }

            const int segmentCount = rightSegment - leftSegment + 1;
            switch (hint) {
            case QAbstractItemView::PositionAtTop:
                return segment;
            case QAbstractItemView::PositionAtBottom:
                return segment - segmentCount + 1;
            case QAbstractItemView::PositionAtCenter:
                return segment - (segmentCount / 2);
            default:
                break;
            }
        }
    }
    return scrollValue;
}